

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTrapeziumProfileDef::~IfcTrapeziumProfileDef
          (IfcTrapeziumProfileDef *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)
   ((long)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr.field_2 + 8
   ) = 0x9701b8;
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.ProfileName.ptr._M_dataplus._M_p =
       (pointer)0x9701e0;
  puVar1 = *(undefined1 **)&this[-1].super_IfcParameterizedProfileDef.field_0x78;
  if ((Out *)puVar1 != &this[-1].TopXDim) {
    operator_delete(puVar1,(long)this[-1].TopXDim + 1);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x58
  ;
  puVar2 = &this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x68;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  operator_delete((void *)((long)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.
                                  ProfileName.ptr.field_2 + 8),0xb8);
  return;
}

Assistant:

IfcTrapeziumProfileDef() : Object("IfcTrapeziumProfileDef") {}